

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.hpp
# Opt level: O0

void __thiscall
generator::tag_b_t<cfgfile::string_trait_t>::set_cfg
          (tag_b_t<cfgfile::string_trait_t> *this,b_t *cfg)

{
  bool bVar1;
  tag_a_t<cfgfile::string_trait_t> *this_00;
  b_t *in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  ptr_to_tag_t p;
  a_t *v;
  const_iterator __end2;
  const_iterator __begin2;
  vector<generator::a_t,_std::allocator<generator::a_t>_> *__range2;
  int *in_stack_000000f8;
  tag_scalar_t<int,_cfgfile::string_trait_t> *in_stack_00000100;
  tag_a_t<cfgfile::string_trait_t> *in_stack_ffffffffffffff48;
  tag_vector_of_tags_t<generator::tag_a_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>
  *in_stack_ffffffffffffff50;
  a_t *in_stack_ffffffffffffff58;
  a_t local_88;
  allocator local_61;
  string local_60 [23];
  undefined1 in_stack_ffffffffffffffb7;
  string_t *in_stack_ffffffffffffffb8;
  tag_a_t<cfgfile::string_trait_t> *in_stack_ffffffffffffffc0;
  __normal_iterator<const_generator::a_t_*,_std::vector<generator::a_t,_std::allocator<generator::a_t>_>_>
  local_20;
  vector<generator::a_t,_std::allocator<generator::a_t>_> *local_18;
  b_t *local_10;
  
  local_10 = in_RSI;
  b_t::integer_field(in_RSI);
  cfgfile::tag_scalar_t<int,_cfgfile::string_trait_t>::set_value
            (in_stack_00000100,in_stack_000000f8);
  local_18 = b_t::a_vector(local_10);
  local_20._M_current =
       (a_t *)std::vector<generator::a_t,_std::allocator<generator::a_t>_>::begin
                        ((vector<generator::a_t,_std::allocator<generator::a_t>_> *)
                         in_stack_ffffffffffffff48);
  std::vector<generator::a_t,_std::allocator<generator::a_t>_>::end
            ((vector<generator::a_t,_std::allocator<generator::a_t>_> *)in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_generator::a_t_*,_std::vector<generator::a_t,_std::allocator<generator::a_t>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<const_generator::a_t_*,_std::vector<generator::a_t,_std::allocator<generator::a_t>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_generator::a_t_*,_std::vector<generator::a_t,_std::allocator<generator::a_t>_>_>
    ::operator*(&local_20);
    this_00 = (tag_a_t<cfgfile::string_trait_t> *)operator_new(0xe8);
    local_88._19_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"a_vector",&local_61);
    tag_a_t<cfgfile::string_trait_t>::tag_a_t
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
    local_88._19_1_ = 0;
    std::shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>>::
    shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>,void>
              ((shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_> *)in_stack_ffffffffffffff50
               ,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::
    __shared_ptr_access<generator::tag_a_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<generator::tag_a_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x106782);
    tag_a_t<cfgfile::string_trait_t>::set_cfg(this_00,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff50 =
         (tag_vector_of_tags_t<generator::tag_a_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>
          *)&in_RDI[1].field_0x10;
    in_stack_ffffffffffffff58 = &local_88;
    std::shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_>::shared_ptr
              ((shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_> *)in_stack_ffffffffffffff50
               ,(shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_> *)
                in_stack_ffffffffffffff48);
    cfgfile::
    tag_vector_of_tags_t<generator::tag_a_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>::
    set_value(in_stack_ffffffffffffff50,(ptr_to_tag_t *)in_stack_ffffffffffffff48);
    std::shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_>::~shared_ptr
              ((shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_> *)0x1067d1);
    std::shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_>::~shared_ptr
              ((shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_> *)0x1067db);
    __gnu_cxx::
    __normal_iterator<const_generator::a_t_*,_std::vector<generator::a_t,_std::allocator<generator::a_t>_>_>
    ::operator++(&local_20);
  }
  cfgfile::tag_t<cfgfile::string_trait_t>::set_defined(in_RDI,true);
  return;
}

Assistant:

void set_cfg( const b_t & cfg )
	{
		this->set_value( cfg.integer_field() );

		for( const generator::a_t & v : cfg.a_vector() )
		{
			typename cfgfile::tag_vector_of_tags_t< generator::tag_a_t< Trait >, Trait >::ptr_to_tag_t p(
				new generator::tag_a_t< Trait >( "a_vector", false ) );

			p->set_cfg( v );

			m_a_vector.set_value( p );
		}

		this->set_defined();
	}